

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O0

void Js::JavascriptExceptionOperators::ThrowStackOverflow
               (ScriptContext *scriptContext,PVOID returnAddress)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ThreadContext *this;
  JavascriptExceptionObject *this_00;
  JavascriptLibrary *this_01;
  JavascriptError *object;
  Var thrownObject;
  JavascriptExceptionObject *so;
  ThreadContext *threadContext;
  PVOID returnAddress_local;
  ScriptContext *scriptContext_local;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x50a,"(scriptContext)","scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  scriptContext->soExceptionCount = scriptContext->soExceptionCount + 1;
  this = ScriptContext::GetThreadContext(scriptContext);
  this_00 = ThreadContext::GetPendingSOErrorObject(this);
  if (this_00 == (JavascriptExceptionObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x50f,"(so)","so");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  ThreadContext::DisableImplicitCall(this);
  this_01 = ScriptContext::GetLibrary(scriptContext);
  object = JavascriptLibrary::CreateStackOverflowError(this_01);
  JavascriptExceptionObject::SetThrownObject(this_00,object);
  ThrowExceptionObject(this_00,scriptContext,false,returnAddress,false);
}

Assistant:

void JavascriptExceptionOperators::ThrowStackOverflow(ScriptContext *scriptContext, PVOID returnAddress)
    {
        Assert(scriptContext);
        DebugOnly(++scriptContext->soExceptionCount);

        ThreadContext *threadContext = scriptContext->GetThreadContext();
        JavascriptExceptionObject *so = threadContext->GetPendingSOErrorObject();
        Assert(so);

        // Disable implicit call before calling into recycler (to prevent QueryContinue/dispose from leave script and stack overflow again)
        threadContext->DisableImplicitCall();

        Var thrownObject = scriptContext->GetLibrary()->CreateStackOverflowError();
        so->SetThrownObject(thrownObject);

        // NOTE: Do not ClearDisableImplicitFlags() here. We still need to allocate StackTrace, etc. Keep implicit call disabled till actual
        // throw (ThrowExceptionObjectInternal will ClearDisableImplicitFlags before throw). If anything wrong happens in between which throws
        // a new exception, the new throw will ClearDisableImplicitFlags.

        JavascriptExceptionOperators::ThrowExceptionObject(so, scriptContext, false, returnAddress);
    }